

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrlist.h
# Opt level: O1

void __thiscall icu_63::NFRuleList::~NFRuleList(NFRuleList *this)

{
  NFRule *this_00;
  void *in_RSI;
  ulong uVar1;
  
  if (this->fStuff != (NFRule **)0x0) {
    if (this->fCount != 0) {
      uVar1 = 0;
      do {
        this_00 = this->fStuff[uVar1];
        if (this_00 != (NFRule *)0x0) {
          NFRule::~NFRule(this_00);
          UMemory::operator_delete((UMemory *)this_00,in_RSI);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->fCount);
    }
    uprv_free_63(this->fStuff);
  }
  return;
}

Assistant:

~NFRuleList() {
        if (fStuff) {
            for(uint32_t i = 0; i < fCount; ++i) {
                delete fStuff[i];
            }
            uprv_free(fStuff);
        }
    }